

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O3

void __thiscall TPZGenGrid2D::SetPointBC(TPZGenGrid2D *this,TPZGeoMesh *gr,TPZVec<double> *x,int bc)

{
  long lVar1;
  TPZGeoEl *this_00;
  int iVar2;
  TPZGeoNode *pTVar3;
  TPZGeoEl **ppTVar4;
  TPZGeoNode *pTVar5;
  int i;
  long nelem;
  TPZGeoElBC local_38;
  
  pTVar3 = TPZGeoMesh::FindNode(gr,x);
  lVar1 = (gr->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < lVar1) {
    nelem = 0;
    do {
      ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(gr->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
      this_00 = *ppTVar4;
      if ((this_00 != (TPZGeoEl *)0x0) &&
         (iVar2 = (**(code **)(*(long *)this_00 + 0x98))(this_00), 0 < iVar2)) {
        i = 0;
        do {
          pTVar5 = TPZGeoEl::NodePtr(this_00,i);
          if (pTVar5 == pTVar3) {
            TPZGeoElBC::TPZGeoElBC(&local_38,this_00,i,bc);
            return;
          }
          i = i + 1;
        } while (iVar2 != i);
      }
      nelem = nelem + 1;
    } while (nelem != lVar1);
  }
  return;
}

Assistant:

void TPZGenGrid2D::SetPointBC(TPZGeoMesh *gr, TPZVec<REAL> &x, int bc) {
    // look for an element/corner node whose distance is close to start
    TPZGeoNode *gn1 = gr->FindNode(x);
    int64_t iel;
    int64_t nelem = gr->ElementVec().NElements();
    TPZGeoEl *gel;
    for (iel = 0; iel < nelem; iel++) {
        gel = gr->ElementVec()[iel];
        if (!gel) continue;
        int nc = gel->NCornerNodes();
        int c;
        for (c = 0; c < nc; c++) {
            TPZGeoNode *gn = gel->NodePtr(c);
            if (gn == gn1) {
                break;
            }
        }
        if (c < nc) {
            TPZGeoElBC(gel, c, bc);
            return;
        }
    }
}